

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68010_rtd(m68k_info *info)

{
  byte bVar1;
  ulong uVar2;
  double dVar3;
  
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\x03';
  if ((info->type & 0x1e) != 0) {
    uVar2 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
    dVar3 = 2.15857280668041e-319;
    if (uVar2 + 2 <= info->code_len) {
      dVar3 = (double)(ulong)(ushort)(*(ushort *)(info->code + uVar2) << 8 |
                                     *(ushort *)(info->code + uVar2) >> 8);
    }
    info->pc = info->pc + 2;
    MCInst_setOpcode(info->inst,0x140);
    (info->extension).op_count = '\x01';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
    (info->extension).operands[0].type = M68K_OP_IMM;
    (info->extension).operands[0].address_mode = M68K_AM_IMMEDIATE;
    (info->extension).operands[0].field_0.dimm = dVar3;
    bVar1 = info->groups_count;
    info->groups_count = bVar1 + 1;
    info->groups[bVar1] = '\x01';
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68010_rtd(m68k_info *info)
{
	set_insn_group(info, M68K_GRP_RET);
	LIMIT_CPU_TYPES(info, M68010_PLUS);
	build_absolute_jump_with_immediate(info, M68K_INS_RTD, 0, read_imm_16(info));
}